

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_callWithPointerParameter_Test::
~TEST_MockExpectedCall_callWithPointerParameter_Test
          (TEST_MockExpectedCall_callWithPointerParameter_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithPointerParameter)
{
    const SimpleString paramName = "paramName";
    void* value = (void*) 0x123;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("void*", call->getInputParameterType(paramName).asCharString());
    POINTERS_EQUAL(value, call->getInputParameter(paramName).getPointerValue());
    STRCMP_CONTAINS("funcName -> void* paramName: <0x123>", call->callToString().asCharString());
}